

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.cc
# Opt level: O0

bool __thiscall
draco::GeometryAttribute::CopyFrom(GeometryAttribute *this,GeometryAttribute *src_att)

{
  uint8_t *data;
  long *in_RSI;
  DataBuffer *in_RDI;
  pointer size;
  
  *(char *)&(in_RDI->descriptor_).buffer_id = (char)in_RSI[3];
  *(undefined4 *)((long)&(in_RDI->descriptor_).buffer_id + 4) = *(undefined4 *)((long)in_RSI + 0x1c)
  ;
  *(byte *)&(in_RDI->descriptor_).buffer_update_count = *(byte *)(in_RSI + 4) & 1;
  in_RDI[1].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_RSI[5];
  in_RDI[1].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_RSI[6];
  *(int *)&in_RDI[1].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage = (int)in_RSI[7];
  (in_RDI->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_RSI[1];
  (in_RDI->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_RSI[2];
  *(undefined4 *)
   ((long)&in_RDI[1].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage + 4) = *(undefined4 *)((long)in_RSI + 0x3c);
  if (*in_RSI == 0) {
    (in_RDI->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
  }
  else {
    if ((in_RDI->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      return false;
    }
    size = (in_RDI->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
    data = DataBuffer::data((DataBuffer *)0x14c9f6);
    DataBuffer::data_size((DataBuffer *)0x14ca08);
    DataBuffer::Update(in_RDI,data,(int64_t)size);
  }
  return true;
}

Assistant:

bool GeometryAttribute::CopyFrom(const GeometryAttribute &src_att) {
  num_components_ = src_att.num_components_;
  data_type_ = src_att.data_type_;
  normalized_ = src_att.normalized_;
  byte_stride_ = src_att.byte_stride_;
  byte_offset_ = src_att.byte_offset_;
  attribute_type_ = src_att.attribute_type_;
  buffer_descriptor_ = src_att.buffer_descriptor_;
  unique_id_ = src_att.unique_id_;
  if (src_att.buffer_ == nullptr) {
    buffer_ = nullptr;
  } else {
    if (buffer_ == nullptr) {
      return false;
    }
    buffer_->Update(src_att.buffer_->data(), src_att.buffer_->data_size());
  }
  return true;
}